

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::decode_next_row(jpeg_decoder *this)

{
  huff_tables *pH;
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  short *psVar9;
  int r;
  int extra_bits;
  ulong local_48;
  short *local_40;
  long local_38;
  
  local_48 = 0;
  do {
    if (this->m_mcus_per_row <= (int)local_48) {
      return;
    }
    if ((this->m_restart_interval != 0) && (this->m_restarts_left == 0)) {
      process_restart(this);
    }
    psVar9 = this->m_pMCU_coefficients;
    lVar8 = 0;
    while (lVar8 < this->m_blocks_per_mcu) {
      iVar6 = this->m_mcu_org[lVar8];
      local_40 = this->m_quant[this->m_comp_quant[iVar6]];
      uVar1 = huff_decode(this,this->m_pHuff_tabs[this->m_comp_dc_tab[iVar6]],&r);
      iVar2 = r;
      if (r < *(int *)(s_extend_test + (ulong)(uVar1 & 0xf) * 4)) {
        iVar2 = r + *(int *)(s_extend_offset + (ulong)(uVar1 & 0xf) * 4);
      }
      uVar3 = iVar2 + this->m_last_dc_val[iVar6];
      this->m_last_dc_val[iVar6] = uVar3;
      *psVar9 = (short)uVar3 * *local_40;
      iVar2 = this->m_mcu_block_max_zag[lVar8];
      pH = this->m_pHuff_tabs[this->m_comp_ac_tab[iVar6]];
      iVar6 = 1;
      local_38 = lVar8;
      while (iVar6 < 0x40) {
        uVar1 = huff_decode(this,pH,&extra_bits);
        r = (int)uVar1 >> 4;
        uVar4 = uVar1 & 0xf;
        if (uVar4 == 0) {
          if (r != 0xf) break;
          if (0x30 < iVar6) {
LAB_0011acc4:
            stop_decoding(this,JPGD_DECODE_ERROR);
          }
          if (iVar6 < iVar2) {
            iVar7 = iVar2 - iVar6;
            if (0xf < iVar2 - iVar6) {
              iVar7 = 0x10;
            }
            for (lVar8 = 0; iVar7 != (int)lVar8; lVar8 = lVar8 + 1) {
              psVar9[*(int *)(g_ZAG + (long)iVar6 * 4 + lVar8 * 4)] = 0;
            }
          }
          iVar7 = iVar6 + 0xf;
        }
        else {
          iVar7 = iVar6;
          if (0xf < uVar1) {
            if (0x3f < r + iVar6) goto LAB_0011acc4;
            iVar7 = r + iVar6;
            if (iVar6 < iVar2) {
              iVar7 = iVar2 - iVar6;
              if (r < iVar2 - iVar6) {
                iVar7 = r;
              }
              for (lVar8 = 0; iVar7 != (int)lVar8; lVar8 = lVar8 + 1) {
                psVar9[*(int *)(g_ZAG + (long)iVar6 * 4 + lVar8 * 4)] = 0;
              }
              iVar7 = iVar6 + r;
            }
          }
          iVar6 = extra_bits;
          if (extra_bits < *(int *)(s_extend_test + (ulong)uVar4 * 4)) {
            iVar6 = extra_bits + *(int *)(s_extend_offset + (ulong)uVar4 * 4);
          }
          psVar9[*(int *)(g_ZAG + (long)iVar7 * 4)] = (short)iVar6 * local_40[iVar7];
        }
        iVar6 = iVar7 + 1;
      }
      if (iVar6 < iVar2) {
        lVar8 = (long)iVar6;
        piVar5 = (int *)(g_ZAG + lVar8 * 4);
        for (; lVar8 < iVar2; lVar8 = lVar8 + 1) {
          psVar9[*piVar5] = 0;
          piVar5 = piVar5 + 1;
        }
      }
      this->m_mcu_block_max_zag[local_38] = iVar6;
      psVar9 = psVar9 + 0x40;
      lVar8 = local_38 + 1;
    }
    iVar6 = (int)local_48;
    if (this->m_freq_domain_chroma_upsample == false) {
      transform_mcu(this,iVar6);
    }
    else {
      transform_mcu_expand(this,iVar6);
    }
    this->m_restarts_left = this->m_restarts_left + -1;
    local_48 = (ulong)(iVar6 + 1);
  } while( true );
}

Assistant:

void jpeg_decoder::decode_next_row() {
  for (int mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++) {
    if ((m_restart_interval) && (m_restarts_left == 0))
      process_restart();

    jpgd_block_t* p = m_pMCU_coefficients;
    for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++, p += 64) {
      int component_id = m_mcu_org[mcu_block];
      jpgd_quant_t* q = m_quant[m_comp_quant[component_id]];

      int r, s;
      s = huff_decode(m_pHuff_tabs[m_comp_dc_tab[component_id]], r);
      s = JPGD_HUFF_EXTEND(r, s);

      m_last_dc_val[component_id] = (s += m_last_dc_val[component_id]);

      p[0] = static_cast<jpgd_block_t>(s * q[0]);

      int prev_num_set = m_mcu_block_max_zag[mcu_block];

      huff_tables* pH = m_pHuff_tabs[m_comp_ac_tab[component_id]];

      int k;
      for (k = 1; k < 64; k++) {
        int extra_bits;
        s = huff_decode(pH, extra_bits);

        r = s >> 4;
        s &= 15;

        if (s) {
          if (r) {
            if ((k + r) > 63)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set) {
              int n = JPGD_MIN(r, prev_num_set - k);
              int kt = k;
              while (n--)
                p[g_ZAG[kt++]] = 0;
            }

            k += r;
          }

          s = JPGD_HUFF_EXTEND(extra_bits, s);

          JPGD_ASSERT(k < 64);

          p[g_ZAG[k]] = static_cast<jpgd_block_t>(dequantize_ac(s, q[k]));  //s * q[k];
        } else {
          if (r == 15) {
            if ((k + 16) > 64)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set) {
              int n = JPGD_MIN(16, prev_num_set - k);
              int kt = k;
              while (n--) {
                JPGD_ASSERT(kt <= 63);
                p[g_ZAG[kt++]] = 0;
              }
            }

            k += 16 - 1;  // - 1 because the loop counter is k
            JPGD_ASSERT(p[g_ZAG[k]] == 0);
          } else
            break;
        }
      }

      if (k < prev_num_set) {
        int kt = k;
        while (kt < prev_num_set)
          p[g_ZAG[kt++]] = 0;
      }

      m_mcu_block_max_zag[mcu_block] = k;
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);

    m_restarts_left--;
  }
}